

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall asl::Array<asl::WebSocket_*>::remove(Array<asl::WebSocket_*> *this,char *__filename)

{
  WebSocket **__dest;
  int iVar1;
  int in_EDX;
  int iVar2;
  
  iVar1 = *(int *)(this->_a + -2);
  iVar2 = in_EDX + (int)__filename;
  if (iVar2 <= iVar1) {
    __dest = this->_a + (int)__filename;
    memmove(__dest,__dest + in_EDX,(long)(iVar1 - iVar2) << 3);
    *(int *)(this->_a + -2) = *(int *)(this->_a + -2) - in_EDX;
    reserve(this,iVar1 - in_EDX);
    *(int *)(this->_a + -2) = iVar1 - in_EDX;
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}